

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O0

Am_Value get_impl_parent_from_group_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar2;
  Am_Slot_Flags in_RSI;
  Am_Value AVar3;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object group;
  Am_Object *self_local;
  Am_Value *value;
  
  group.data._7_1_ = 0;
  Am_Value::Am_Value((Am_Value *)self);
  Am_Object::Get_Owner(&local_30,in_RSI);
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)&local_30);
  Am_Object::~Am_Object(&local_30);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    in_value = Am_Object::Peek(&local_28,0xc5,0);
    Am_Value::operator=((Am_Value *)self,in_value);
  }
  else {
    Am_Value::operator=((Am_Value *)self,-1);
  }
  group.data._7_1_ = 1;
  Am_Object::~Am_Object(&local_28);
  aVar2 = extraout_RDX;
  if ((group.data._7_1_ & 1) == 0) {
    Am_Value::~Am_Value((Am_Value *)self);
    aVar2 = extraout_RDX_00;
  }
  AVar3.value.wrapper_value = aVar2.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, get_impl_parent_from_group)
{
  Am_Value value;
  //self is cmd, owner is scroll_bar, owner is scroll_group
  Am_Object group = self.Get_Owner().Get_Owner();
  if (group.Valid())
    value = group.Peek(Am_COMMAND);
  else
    value = Am_NOT_USUALLY_UNDONE;
  return value;
}